

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O1

bool caffe::UpgradeV0LayerParameter
               (V1LayerParameter *v0_layer_connection,V1LayerParameter *layer_param)

{
  uint32 *puVar1;
  HasBits<1UL> *pHVar2;
  byte *pbVar3;
  float fVar4;
  int iVar5;
  uint uVar6;
  uint32 uVar7;
  string *psVar8;
  string *psVar9;
  string *psVar10;
  bool bVar11;
  bool bVar12;
  V1LayerParameter_LayerType value;
  Type *pTVar13;
  Type *this;
  Type *from;
  float *pfVar14;
  InnerProductParameter *pIVar15;
  FillerParameter *pFVar16;
  ConvolutionParameter *pCVar17;
  PoolingParameter *pPVar18;
  DropoutParameter *pDVar19;
  LRNParameter *pLVar20;
  InfogainLossParameter *this_00;
  TransformationParameter *pTVar21;
  HDF5DataParameter *pHVar22;
  DataParameter *pDVar23;
  ImageDataParameter *pIVar24;
  ConcatParameter *pCVar25;
  WindowDataParameter *pWVar26;
  HDF5OutputParameter *pHVar27;
  int iVar28;
  FillerParameter *pFVar29;
  V0LayerParameter *pVVar30;
  
  V1LayerParameter::Clear(layer_param);
  if (0 < (v0_layer_connection->bottom_).super_RepeatedPtrFieldBase.current_size_) {
    iVar28 = 0;
    do {
      pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&(v0_layer_connection->bottom_).super_RepeatedPtrFieldBase,iVar28);
      V1LayerParameter::add_bottom(layer_param,pTVar13);
      iVar28 = iVar28 + 1;
    } while (iVar28 < (v0_layer_connection->bottom_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (v0_layer_connection->top_).super_RepeatedPtrFieldBase.current_size_) {
    iVar28 = 0;
    do {
      pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&(v0_layer_connection->top_).super_RepeatedPtrFieldBase,iVar28);
      V1LayerParameter::add_top(layer_param,pTVar13);
      iVar28 = iVar28 + 1;
    } while (iVar28 < (v0_layer_connection->top_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (((v0_layer_connection->_has_bits_).has_bits_[0] & 2) == 0) {
    return true;
  }
  pVVar30 = v0_layer_connection->layer_;
  if (pVVar30 == (V0LayerParameter *)0x0) {
    pVVar30 = (V0LayerParameter *)&_V0LayerParameter_default_instance_;
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 1) != 0) {
    psVar8 = (pVVar30->name_).ptr_;
    (layer_param->_has_bits_).has_bits_[0] = (layer_param->_has_bits_).has_bits_[0] | 1;
    psVar9 = (layer_param->name_).ptr_;
    if (psVar9 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&layer_param->name_,psVar8);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar9);
    }
  }
  psVar8 = (pVVar30->type_).ptr_;
  if (((pVVar30->_has_bits_).has_bits_[0] & 2) != 0) {
    value = UpgradeV0LayerType(psVar8);
    bVar11 = V1LayerParameter_LayerType_IsValid(value);
    if (!bVar11) {
      __assert_fail("::caffe::V1LayerParameter_LayerType_IsValid(value)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                    ,0x5996,
                    "void caffe::V1LayerParameter::set_type(::caffe::V1LayerParameter_LayerType)");
    }
    puVar1 = (layer_param->_has_bits_).has_bits_ + 1;
    *(byte *)puVar1 = (byte)*puVar1 | 1;
    layer_param->type_ = value;
  }
  if (0 < (pVVar30->blobs_).super_RepeatedPtrFieldBase.current_size_) {
    iVar28 = 0;
    do {
      this = google::protobuf::internal::RepeatedPtrFieldBase::
             Add<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                       (&(layer_param->blobs_).super_RepeatedPtrFieldBase,(Type *)0x0);
      from = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                       (&(pVVar30->blobs_).super_RepeatedPtrFieldBase,iVar28);
      BlobProto::CopyFrom(this,from);
      iVar28 = iVar28 + 1;
    } while (iVar28 < (pVVar30->blobs_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (pVVar30->blobs_lr_).current_size_) {
    iVar28 = 0;
    do {
      pfVar14 = google::protobuf::RepeatedField<float>::Get(&pVVar30->blobs_lr_,iVar28);
      fVar4 = *pfVar14;
      iVar5 = (layer_param->blobs_lr_).total_size_;
      if ((layer_param->blobs_lr_).current_size_ == iVar5) {
        google::protobuf::RepeatedField<float>::Reserve(&layer_param->blobs_lr_,iVar5 + 1);
      }
      iVar5 = (layer_param->blobs_lr_).current_size_;
      (layer_param->blobs_lr_).current_size_ = iVar5 + 1;
      ((layer_param->blobs_lr_).rep_)->elements[iVar5] = fVar4;
      iVar28 = iVar28 + 1;
    } while (iVar28 < (pVVar30->blobs_lr_).current_size_);
  }
  if (0 < (pVVar30->weight_decay_).current_size_) {
    iVar28 = 0;
    do {
      pfVar14 = google::protobuf::RepeatedField<float>::Get(&pVVar30->weight_decay_,iVar28);
      fVar4 = *pfVar14;
      iVar5 = (layer_param->weight_decay_).total_size_;
      if ((layer_param->weight_decay_).current_size_ == iVar5) {
        google::protobuf::RepeatedField<float>::Reserve(&layer_param->weight_decay_,iVar5 + 1);
      }
      iVar5 = (layer_param->weight_decay_).current_size_;
      (layer_param->weight_decay_).current_size_ = iVar5 + 1;
      ((layer_param->weight_decay_).rep_)->elements[iVar5] = fVar4;
      iVar28 = iVar28 + 1;
    } while (iVar28 < (pVVar30->weight_decay_).current_size_);
  }
  bVar11 = true;
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x100) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 8;
      if (layer_param->convolution_param_ == (ConvolutionParameter *)0x0) {
        pCVar17 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar17);
        layer_param->convolution_param_ = pCVar17;
      }
      pCVar17 = layer_param->convolution_param_;
      uVar7 = pVVar30->num_output_;
      pHVar2 = &pCVar17->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 4;
      pCVar17->num_output_ = uVar7;
    }
    else {
      iVar28 = std::__cxx11::string::compare((char *)psVar8);
      if (iVar28 == 0) {
        pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar3 = *pbVar3 | 4;
        if (layer_param->inner_product_param_ == (InnerProductParameter *)0x0) {
          pIVar15 = (InnerProductParameter *)operator_new(0x38);
          InnerProductParameter::InnerProductParameter(pIVar15);
          layer_param->inner_product_param_ = pIVar15;
        }
        pIVar15 = layer_param->inner_product_param_;
        uVar7 = pVVar30->num_output_;
        pHVar2 = &pIVar15->_has_bits_;
        pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 4;
        pIVar15->num_output_ = uVar7;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown parameter num_output for layer type ",0x2c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
        bVar11 = false;
      }
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x800000) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 8;
      if (layer_param->convolution_param_ == (ConvolutionParameter *)0x0) {
        pCVar17 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar17);
        layer_param->convolution_param_ = pCVar17;
      }
      pCVar17 = layer_param->convolution_param_;
      bVar12 = pVVar30->biasterm_;
      pHVar2 = &pCVar17->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 0x1000;
      pCVar17->bias_term_ = bVar12;
    }
    else {
      iVar28 = std::__cxx11::string::compare((char *)psVar8);
      if (iVar28 == 0) {
        pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar3 = *pbVar3 | 4;
        if (layer_param->inner_product_param_ == (InnerProductParameter *)0x0) {
          pIVar15 = (InnerProductParameter *)operator_new(0x38);
          InnerProductParameter::InnerProductParameter(pIVar15);
          layer_param->inner_product_param_ = pIVar15;
        }
        pIVar15 = layer_param->inner_product_param_;
        bVar12 = pVVar30->biasterm_;
        pHVar2 = &pIVar15->_has_bits_;
        pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 0x10;
        pIVar15->bias_term_ = bVar12;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown parameter biasterm for layer type ",0x2a);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
        bVar11 = false;
      }
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x20) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 8;
      if (layer_param->convolution_param_ == (ConvolutionParameter *)0x0) {
        pCVar17 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar17);
        layer_param->convolution_param_ = pCVar17;
      }
      pCVar17 = layer_param->convolution_param_;
      (pCVar17->_has_bits_).has_bits_[0] = (pCVar17->_has_bits_).has_bits_[0] | 1;
      if (pCVar17->weight_filler_ == (FillerParameter *)0x0) {
        pFVar16 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(pFVar16);
        pCVar17->weight_filler_ = pFVar16;
      }
      pFVar16 = pCVar17->weight_filler_;
    }
    else {
      iVar28 = std::__cxx11::string::compare((char *)psVar8);
      if (iVar28 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown parameter weight_filler for layer type ",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
        bVar11 = false;
        goto LAB_0043f227;
      }
      pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 4;
      if (layer_param->inner_product_param_ == (InnerProductParameter *)0x0) {
        pIVar15 = (InnerProductParameter *)operator_new(0x38);
        InnerProductParameter::InnerProductParameter(pIVar15);
        layer_param->inner_product_param_ = pIVar15;
      }
      pIVar15 = layer_param->inner_product_param_;
      (pIVar15->_has_bits_).has_bits_[0] = (pIVar15->_has_bits_).has_bits_[0] | 1;
      if (pIVar15->weight_filler_ == (FillerParameter *)0x0) {
        pFVar16 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(pFVar16);
        pIVar15->weight_filler_ = pFVar16;
      }
      pFVar16 = pIVar15->weight_filler_;
    }
    pFVar29 = pVVar30->weight_filler_;
    if (pFVar29 == (FillerParameter *)0x0) {
      pFVar29 = (FillerParameter *)&_FillerParameter_default_instance_;
    }
    FillerParameter::CopyFrom(pFVar16,pFVar29);
  }
LAB_0043f227:
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x40) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 8;
      if (layer_param->convolution_param_ == (ConvolutionParameter *)0x0) {
        pCVar17 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar17);
        layer_param->convolution_param_ = pCVar17;
      }
      pCVar17 = layer_param->convolution_param_;
      (pCVar17->_has_bits_).has_bits_[0] = (pCVar17->_has_bits_).has_bits_[0] | 2;
      if (pCVar17->bias_filler_ == (FillerParameter *)0x0) {
        pFVar16 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(pFVar16);
        pCVar17->bias_filler_ = pFVar16;
      }
      pFVar16 = pCVar17->bias_filler_;
    }
    else {
      iVar28 = std::__cxx11::string::compare((char *)psVar8);
      if (iVar28 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown parameter bias_filler for layer type ",0x2d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
        bVar11 = false;
        goto LAB_0043f364;
      }
      pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 4;
      if (layer_param->inner_product_param_ == (InnerProductParameter *)0x0) {
        pIVar15 = (InnerProductParameter *)operator_new(0x38);
        InnerProductParameter::InnerProductParameter(pIVar15);
        layer_param->inner_product_param_ = pIVar15;
      }
      pIVar15 = layer_param->inner_product_param_;
      (pIVar15->_has_bits_).has_bits_[0] = (pIVar15->_has_bits_).has_bits_[0] | 2;
      if (pIVar15->bias_filler_ == (FillerParameter *)0x0) {
        pFVar16 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(pFVar16);
        pIVar15->bias_filler_ = pFVar16;
      }
      pFVar16 = pIVar15->bias_filler_;
    }
    pFVar29 = pVVar30->bias_filler_;
    if (pFVar29 == (FillerParameter *)0x0) {
      pFVar29 = (FillerParameter *)&_FillerParameter_default_instance_;
    }
    FillerParameter::CopyFrom(pFVar16,pFVar29);
  }
LAB_0043f364:
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x200) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 8;
      if (layer_param->convolution_param_ == (ConvolutionParameter *)0x0) {
        pCVar17 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar17);
        layer_param->convolution_param_ = pCVar17;
      }
      pCVar17 = layer_param->convolution_param_;
      uVar6 = pVVar30->pad_;
      iVar28 = (pCVar17->pad_).total_size_;
      if ((pCVar17->pad_).current_size_ == iVar28) {
        google::protobuf::RepeatedField<unsigned_int>::Reserve(&pCVar17->pad_,iVar28 + 1);
      }
      iVar28 = (pCVar17->pad_).current_size_;
      (pCVar17->pad_).current_size_ = iVar28 + 1;
      ((pCVar17->pad_).rep_)->elements[iVar28] = uVar6;
    }
    else {
      iVar28 = std::__cxx11::string::compare((char *)psVar8);
      if (iVar28 == 0) {
        pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar3 = *pbVar3 | 0x10;
        if (layer_param->pooling_param_ == (PoolingParameter *)0x0) {
          pPVar18 = (PoolingParameter *)operator_new(0x48);
          PoolingParameter::PoolingParameter(pPVar18);
          layer_param->pooling_param_ = pPVar18;
        }
        pPVar18 = layer_param->pooling_param_;
        uVar7 = pVVar30->pad_;
        pHVar2 = &pPVar18->_has_bits_;
        pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 4;
        pPVar18->pad_ = uVar7;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown parameter pad for layer type ",0x25);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
        bVar11 = false;
      }
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x400) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 8;
      if (layer_param->convolution_param_ == (ConvolutionParameter *)0x0) {
        pCVar17 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar17);
        layer_param->convolution_param_ = pCVar17;
      }
      pCVar17 = layer_param->convolution_param_;
      uVar6 = pVVar30->kernelsize_;
      iVar28 = (pCVar17->kernel_size_).total_size_;
      if ((pCVar17->kernel_size_).current_size_ == iVar28) {
        google::protobuf::RepeatedField<unsigned_int>::Reserve(&pCVar17->kernel_size_,iVar28 + 1);
      }
      iVar28 = (pCVar17->kernel_size_).current_size_;
      (pCVar17->kernel_size_).current_size_ = iVar28 + 1;
      ((pCVar17->kernel_size_).rep_)->elements[iVar28] = uVar6;
    }
    else {
      iVar28 = std::__cxx11::string::compare((char *)psVar8);
      if (iVar28 == 0) {
        pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar3 = *pbVar3 | 0x10;
        if (layer_param->pooling_param_ == (PoolingParameter *)0x0) {
          pPVar18 = (PoolingParameter *)operator_new(0x48);
          PoolingParameter::PoolingParameter(pPVar18);
          layer_param->pooling_param_ = pPVar18;
        }
        pPVar18 = layer_param->pooling_param_;
        uVar7 = pVVar30->kernelsize_;
        pHVar2 = &pPVar18->_has_bits_;
        pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 2;
        pPVar18->kernel_size_ = uVar7;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown parameter kernelsize for layer type ",0x2c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
        bVar11 = false;
      }
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x1000000) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 8;
      if (layer_param->convolution_param_ == (ConvolutionParameter *)0x0) {
        pCVar17 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar17);
        layer_param->convolution_param_ = pCVar17;
      }
      pCVar17 = layer_param->convolution_param_;
      uVar7 = pVVar30->group_;
      pHVar2 = &pCVar17->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 0x2000;
      pCVar17->group_ = uVar7;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter group for layer type ",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      bVar11 = false;
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x2000000) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 8;
      if (layer_param->convolution_param_ == (ConvolutionParameter *)0x0) {
        pCVar17 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar17);
        layer_param->convolution_param_ = pCVar17;
      }
      pCVar17 = layer_param->convolution_param_;
      uVar6 = pVVar30->stride_;
      iVar28 = (pCVar17->stride_).total_size_;
      if ((pCVar17->stride_).current_size_ == iVar28) {
        google::protobuf::RepeatedField<unsigned_int>::Reserve(&pCVar17->stride_,iVar28 + 1);
      }
      iVar28 = (pCVar17->stride_).current_size_;
      (pCVar17->stride_).current_size_ = iVar28 + 1;
      ((pCVar17->stride_).rep_)->elements[iVar28] = uVar6;
    }
    else {
      iVar28 = std::__cxx11::string::compare((char *)psVar8);
      if (iVar28 == 0) {
        pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar3 = *pbVar3 | 0x10;
        if (layer_param->pooling_param_ == (PoolingParameter *)0x0) {
          pPVar18 = (PoolingParameter *)operator_new(0x48);
          PoolingParameter::PoolingParameter(pPVar18);
          layer_param->pooling_param_ = pPVar18;
        }
        pPVar18 = layer_param->pooling_param_;
        uVar7 = pVVar30->stride_;
        pHVar2 = &pPVar18->_has_bits_;
        pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 0x800;
        pPVar18->stride_ = uVar7;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown parameter stride for layer type ",0x28);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
        bVar11 = false;
      }
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x800) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      iVar28 = pVVar30->pool_;
      if (iVar28 == 2) {
        pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar3 = *pbVar3 | 0x10;
        if (layer_param->pooling_param_ == (PoolingParameter *)0x0) {
          pPVar18 = (PoolingParameter *)operator_new(0x48);
          PoolingParameter::PoolingParameter(pPVar18);
          layer_param->pooling_param_ = pPVar18;
        }
        pPVar18 = layer_param->pooling_param_;
        bVar12 = PoolingParameter_PoolMethod_IsValid(2);
        if (!bVar12) {
LAB_00440695:
          __assert_fail("::caffe::PoolingParameter_PoolMethod_IsValid(value)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                        ,0x50e0,
                        "void caffe::PoolingParameter::set_pool(::caffe::PoolingParameter_PoolMethod)"
                       );
        }
        pHVar2 = &pPVar18->_has_bits_;
        *(byte *)pHVar2->has_bits_ = (byte)pHVar2->has_bits_[0] | 1;
        pPVar18->pool_ = 2;
      }
      else if (iVar28 == 1) {
        pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar3 = *pbVar3 | 0x10;
        if (layer_param->pooling_param_ == (PoolingParameter *)0x0) {
          pPVar18 = (PoolingParameter *)operator_new(0x48);
          PoolingParameter::PoolingParameter(pPVar18);
          layer_param->pooling_param_ = pPVar18;
        }
        pPVar18 = layer_param->pooling_param_;
        bVar12 = PoolingParameter_PoolMethod_IsValid(1);
        if (!bVar12) goto LAB_00440695;
        pHVar2 = &pPVar18->_has_bits_;
        *(byte *)pHVar2->has_bits_ = (byte)pHVar2->has_bits_[0] | 1;
        pPVar18->pool_ = 1;
      }
      else {
        if (iVar28 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unknown pool method ",0x14);
          std::ostream::operator<<((ostream *)&std::cerr,iVar28);
          goto LAB_0043f75d;
        }
        pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar3 = *pbVar3 | 0x10;
        if (layer_param->pooling_param_ == (PoolingParameter *)0x0) {
          pPVar18 = (PoolingParameter *)operator_new(0x48);
          PoolingParameter::PoolingParameter(pPVar18);
          layer_param->pooling_param_ = pPVar18;
        }
        pPVar18 = layer_param->pooling_param_;
        bVar12 = PoolingParameter_PoolMethod_IsValid(0);
        if (!bVar12) goto LAB_00440695;
        pHVar2 = &pPVar18->_has_bits_;
        *(byte *)pHVar2->has_bits_ = (byte)pHVar2->has_bits_[0] | 1;
        pPVar18->pool_ = 0;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter pool for layer type ",0x26);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
LAB_0043f75d:
      bVar11 = false;
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x4000000) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 0x20;
      if (layer_param->dropout_param_ == (DropoutParameter *)0x0) {
        pDVar19 = (DropoutParameter *)operator_new(0x20);
        DropoutParameter::DropoutParameter(pDVar19);
        layer_param->dropout_param_ = pDVar19;
      }
      pDVar19 = layer_param->dropout_param_;
      fVar4 = pVVar30->dropout_ratio_;
      pHVar2 = &pDVar19->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 1;
      pDVar19->dropout_ratio_ = fVar4;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter dropout_ratio for layer type ",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      bVar11 = false;
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x8000000) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 8;
      if (layer_param->lrn_param_ == (LRNParameter *)0x0) {
        pLVar20 = (LRNParameter *)operator_new(0x30);
        LRNParameter::LRNParameter(pLVar20);
        layer_param->lrn_param_ = pLVar20;
      }
      pLVar20 = layer_param->lrn_param_;
      uVar7 = pVVar30->local_size_;
      pHVar2 = &pLVar20->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 4;
      pLVar20->local_size_ = uVar7;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter local_size for layer type ",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      bVar11 = false;
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x10000000) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 8;
      if (layer_param->lrn_param_ == (LRNParameter *)0x0) {
        pLVar20 = (LRNParameter *)operator_new(0x30);
        LRNParameter::LRNParameter(pLVar20);
        layer_param->lrn_param_ = pLVar20;
      }
      pLVar20 = layer_param->lrn_param_;
      fVar4 = pVVar30->alpha_;
      pHVar2 = &pLVar20->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 8;
      pLVar20->alpha_ = fVar4;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter alpha for layer type ",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      bVar11 = false;
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x20000000) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 8;
      if (layer_param->lrn_param_ == (LRNParameter *)0x0) {
        pLVar20 = (LRNParameter *)operator_new(0x30);
        LRNParameter::LRNParameter(pLVar20);
        layer_param->lrn_param_ = pLVar20;
      }
      pLVar20 = layer_param->lrn_param_;
      fVar4 = pVVar30->beta_;
      pHVar2 = &pLVar20->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 0x10;
      pLVar20->beta_ = fVar4;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter beta for layer type ",0x26);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      bVar11 = false;
    }
  }
  if ((int)(pVVar30->_has_bits_).has_bits_[0] < 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 8;
      if (layer_param->lrn_param_ == (LRNParameter *)0x0) {
        pLVar20 = (LRNParameter *)operator_new(0x30);
        LRNParameter::LRNParameter(pLVar20);
        layer_param->lrn_param_ = pLVar20;
      }
      pLVar20 = layer_param->lrn_param_;
      fVar4 = pVVar30->k_;
      pHVar2 = &pLVar20->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 0x20;
      pLVar20->k_ = fVar4;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter k for layer type ",0x23);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      bVar11 = false;
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 4) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 0x10;
      if (layer_param->data_param_ == (DataParameter *)0x0) {
        pDVar23 = (DataParameter *)operator_new(0x48);
        DataParameter::DataParameter(pDVar23);
        layer_param->data_param_ = pDVar23;
      }
      pIVar24 = (ImageDataParameter *)layer_param->data_param_;
    }
    else {
      iVar28 = std::__cxx11::string::compare((char *)psVar8);
      if (iVar28 == 0) {
        *(byte *)(layer_param->_has_bits_).has_bits_ =
             (byte)(layer_param->_has_bits_).has_bits_[0] | 0x40;
        if (layer_param->hdf5_data_param_ == (HDF5DataParameter *)0x0) {
          pHVar22 = (HDF5DataParameter *)operator_new(0x28);
          HDF5DataParameter::HDF5DataParameter(pHVar22);
          layer_param->hdf5_data_param_ = pHVar22;
        }
        pIVar24 = (ImageDataParameter *)layer_param->hdf5_data_param_;
      }
      else {
        iVar28 = std::__cxx11::string::compare((char *)psVar8);
        if (iVar28 != 0) {
          iVar28 = std::__cxx11::string::compare((char *)psVar8);
          if (iVar28 == 0) {
            pWVar26 = V1LayerParameter::mutable_window_data_param(layer_param);
            WindowDataParameter::set_source(pWVar26,(pVVar30->source_).ptr_);
          }
          else {
            iVar28 = std::__cxx11::string::compare((char *)psVar8);
            if (iVar28 == 0) {
              this_00 = V1LayerParameter::mutable_infogain_loss_param(layer_param);
              InfogainLossParameter::set_source(this_00,(pVVar30->source_).ptr_);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Unknown parameter source for layer type ",0x28);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
              bVar11 = false;
            }
          }
          goto LAB_0043fd1e;
        }
        pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar3 = *pbVar3 | 1;
        if (layer_param->image_data_param_ == (ImageDataParameter *)0x0) {
          pIVar24 = (ImageDataParameter *)operator_new(0x50);
          ImageDataParameter::ImageDataParameter(pIVar24);
          layer_param->image_data_param_ = pIVar24;
        }
        pIVar24 = layer_param->image_data_param_;
      }
    }
    psVar9 = (pVVar30->source_).ptr_;
    (pIVar24->_has_bits_).has_bits_[0] = (pIVar24->_has_bits_).has_bits_[0] | 1;
    psVar10 = (pIVar24->source_).ptr_;
    if (psVar10 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pIVar24->source_,psVar9);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar10);
    }
  }
LAB_0043fd1e:
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x40000000) != 0) {
    pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 3);
    *pbVar3 = *pbVar3 | 2;
    if (layer_param->transform_param_ == (TransformationParameter *)0x0) {
      pTVar21 = (TransformationParameter *)operator_new(0x40);
      TransformationParameter::TransformationParameter(pTVar21);
      layer_param->transform_param_ = pTVar21;
    }
    pTVar21 = layer_param->transform_param_;
    fVar4 = pVVar30->scale_;
    pHVar2 = &pTVar21->_has_bits_;
    pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 0x20;
    pTVar21->scale_ = fVar4;
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 8) != 0) {
    pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 3);
    *pbVar3 = *pbVar3 | 2;
    if (layer_param->transform_param_ == (TransformationParameter *)0x0) {
      pTVar21 = (TransformationParameter *)operator_new(0x40);
      TransformationParameter::TransformationParameter(pTVar21);
      layer_param->transform_param_ = pTVar21;
    }
    pTVar21 = layer_param->transform_param_;
    psVar9 = (pVVar30->meanfile_).ptr_;
    (pTVar21->_has_bits_).has_bits_[0] = (pTVar21->_has_bits_).has_bits_[0] | 1;
    psVar10 = (pTVar21->mean_file_).ptr_;
    if (psVar10 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar21->mean_file_,psVar9)
      ;
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar10);
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x1000) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 0x10;
      if (layer_param->data_param_ == (DataParameter *)0x0) {
        pDVar23 = (DataParameter *)operator_new(0x48);
        DataParameter::DataParameter(pDVar23);
        layer_param->data_param_ = pDVar23;
      }
      pDVar23 = layer_param->data_param_;
      uVar7 = pVVar30->batchsize_;
      pHVar2 = &pDVar23->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 4;
      pDVar23->batch_size_ = uVar7;
    }
    else {
      iVar28 = std::__cxx11::string::compare((char *)psVar8);
      if (iVar28 == 0) {
        *(byte *)(layer_param->_has_bits_).has_bits_ =
             (byte)(layer_param->_has_bits_).has_bits_[0] | 0x40;
        if (layer_param->hdf5_data_param_ == (HDF5DataParameter *)0x0) {
          pHVar22 = (HDF5DataParameter *)operator_new(0x28);
          HDF5DataParameter::HDF5DataParameter(pHVar22);
          layer_param->hdf5_data_param_ = pHVar22;
        }
        pHVar22 = layer_param->hdf5_data_param_;
        uVar7 = pVVar30->batchsize_;
        pHVar2 = &pHVar22->_has_bits_;
        pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 2;
        pHVar22->batch_size_ = uVar7;
      }
      else {
        iVar28 = std::__cxx11::string::compare((char *)psVar8);
        if (iVar28 == 0) {
          pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
          *pbVar3 = *pbVar3 | 1;
          if (layer_param->image_data_param_ == (ImageDataParameter *)0x0) {
            pIVar24 = (ImageDataParameter *)operator_new(0x50);
            ImageDataParameter::ImageDataParameter(pIVar24);
            layer_param->image_data_param_ = pIVar24;
          }
          pIVar24 = layer_param->image_data_param_;
          uVar7 = pVVar30->batchsize_;
          pHVar2 = &pIVar24->_has_bits_;
          pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 0x800;
          pIVar24->batch_size_ = uVar7;
        }
        else {
          iVar28 = std::__cxx11::string::compare((char *)psVar8);
          if (iVar28 == 0) {
            pWVar26 = V1LayerParameter::mutable_window_data_param(layer_param);
            uVar7 = pVVar30->batchsize_;
            (pWVar26->_has_bits_).has_bits_[0] = (pWVar26->_has_bits_).has_bits_[0] | 0x10;
            pWVar26->batch_size_ = uVar7;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Unknown parameter batchsize for layer type ",0x2b);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
            bVar11 = false;
          }
        }
      }
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x2000) != 0) {
    pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 3);
    *pbVar3 = *pbVar3 | 2;
    if (layer_param->transform_param_ == (TransformationParameter *)0x0) {
      pTVar21 = (TransformationParameter *)operator_new(0x40);
      TransformationParameter::TransformationParameter(pTVar21);
      layer_param->transform_param_ = pTVar21;
    }
    pTVar21 = layer_param->transform_param_;
    uVar7 = pVVar30->cropsize_;
    pHVar2 = &pTVar21->_has_bits_;
    pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 2;
    pTVar21->crop_size_ = uVar7;
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x8000) != 0) {
    pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 3);
    *pbVar3 = *pbVar3 | 2;
    if (layer_param->transform_param_ == (TransformationParameter *)0x0) {
      pTVar21 = (TransformationParameter *)operator_new(0x40);
      TransformationParameter::TransformationParameter(pTVar21);
      layer_param->transform_param_ = pTVar21;
    }
    pTVar21 = layer_param->transform_param_;
    bVar12 = pVVar30->mirror_;
    pHVar2 = &pTVar21->_has_bits_;
    pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 4;
    pTVar21->mirror_ = bVar12;
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x20000) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 0x10;
      if (layer_param->data_param_ == (DataParameter *)0x0) {
        pDVar23 = (DataParameter *)operator_new(0x48);
        DataParameter::DataParameter(pDVar23);
        layer_param->data_param_ = pDVar23;
      }
      pDVar23 = layer_param->data_param_;
      uVar7 = pVVar30->rand_skip_;
      pHVar2 = &pDVar23->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 0x10;
      pDVar23->rand_skip_ = uVar7;
    }
    else {
      iVar28 = std::__cxx11::string::compare((char *)psVar8);
      if (iVar28 == 0) {
        pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar3 = *pbVar3 | 1;
        if (layer_param->image_data_param_ == (ImageDataParameter *)0x0) {
          pIVar24 = (ImageDataParameter *)operator_new(0x50);
          ImageDataParameter::ImageDataParameter(pIVar24);
          layer_param->image_data_param_ = pIVar24;
        }
        pIVar24 = layer_param->image_data_param_;
        uVar7 = pVVar30->rand_skip_;
        pHVar2 = &pIVar24->_has_bits_;
        pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 0x10;
        pIVar24->rand_skip_ = uVar7;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown parameter rand_skip for layer type ",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
        bVar11 = false;
      }
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x10000) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 1;
      if (layer_param->image_data_param_ == (ImageDataParameter *)0x0) {
        pIVar24 = (ImageDataParameter *)operator_new(0x50);
        ImageDataParameter::ImageDataParameter(pIVar24);
        layer_param->image_data_param_ = pIVar24;
      }
      pIVar24 = layer_param->image_data_param_;
      bVar12 = pVVar30->shuffle_images_;
      pHVar2 = &pIVar24->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 0x20;
      pIVar24->shuffle_ = bVar12;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter shuffle for layer type ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      bVar11 = false;
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x200000) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 1;
      if (layer_param->image_data_param_ == (ImageDataParameter *)0x0) {
        pIVar24 = (ImageDataParameter *)operator_new(0x50);
        ImageDataParameter::ImageDataParameter(pIVar24);
        layer_param->image_data_param_ = pIVar24;
      }
      pIVar24 = layer_param->image_data_param_;
      uVar7 = pVVar30->new_height_;
      pHVar2 = &pIVar24->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 0x80;
      pIVar24->new_height_ = uVar7;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter new_height for layer type ",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      bVar11 = false;
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x4000) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 1;
      if (layer_param->image_data_param_ == (ImageDataParameter *)0x0) {
        pIVar24 = (ImageDataParameter *)operator_new(0x50);
        ImageDataParameter::ImageDataParameter(pIVar24);
        layer_param->image_data_param_ = pIVar24;
      }
      pIVar24 = layer_param->image_data_param_;
      uVar7 = pVVar30->new_width_;
      pHVar2 = &pIVar24->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 0x100;
      pIVar24->new_width_ = uVar7;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter new_width for layer type ",0x2b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      bVar11 = false;
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x400000) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 4;
      if (layer_param->concat_param_ == (ConcatParameter *)0x0) {
        pCVar25 = (ConcatParameter *)operator_new(0x20);
        ConcatParameter::ConcatParameter(pCVar25);
        layer_param->concat_param_ = pCVar25;
      }
      pCVar25 = layer_param->concat_param_;
      uVar7 = pVVar30->concat_dim_;
      pHVar2 = &pCVar25->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 1;
      pCVar25->concat_dim_ = uVar7;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter concat_dim for layer type ",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      bVar11 = false;
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[1] & 1) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 0x20;
      if (layer_param->window_data_param_ == (WindowDataParameter *)0x0) {
        pWVar26 = (WindowDataParameter *)operator_new(0x58);
        WindowDataParameter::WindowDataParameter(pWVar26);
        layer_param->window_data_param_ = pWVar26;
      }
      pWVar26 = layer_param->window_data_param_;
      fVar4 = pVVar30->det_fg_threshold_;
      pHVar2 = &pWVar26->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 0x400;
      pWVar26->fg_threshold_ = fVar4;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter det_fg_threshold for layer type ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      bVar11 = false;
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[1] & 2) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 0x20;
      if (layer_param->window_data_param_ == (WindowDataParameter *)0x0) {
        pWVar26 = (WindowDataParameter *)operator_new(0x58);
        WindowDataParameter::WindowDataParameter(pWVar26);
        layer_param->window_data_param_ = pWVar26;
      }
      pWVar26 = layer_param->window_data_param_;
      fVar4 = pVVar30->det_bg_threshold_;
      pHVar2 = &pWVar26->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 0x800;
      pWVar26->bg_threshold_ = fVar4;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter det_bg_threshold for layer type ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      bVar11 = false;
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[1] & 4) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 0x20;
      if (layer_param->window_data_param_ == (WindowDataParameter *)0x0) {
        pWVar26 = (WindowDataParameter *)operator_new(0x58);
        WindowDataParameter::WindowDataParameter(pWVar26);
        layer_param->window_data_param_ = pWVar26;
      }
      pWVar26 = layer_param->window_data_param_;
      fVar4 = pVVar30->det_fg_fraction_;
      pHVar2 = &pWVar26->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 0x1000;
      pWVar26->fg_fraction_ = fVar4;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter det_fg_fraction for layer type ",0x31);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      bVar11 = false;
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x40000) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 0x20;
      if (layer_param->window_data_param_ == (WindowDataParameter *)0x0) {
        pWVar26 = (WindowDataParameter *)operator_new(0x58);
        WindowDataParameter::WindowDataParameter(pWVar26);
        layer_param->window_data_param_ = pWVar26;
      }
      pWVar26 = layer_param->window_data_param_;
      uVar7 = pVVar30->det_context_pad_;
      pHVar2 = &pWVar26->_has_bits_;
      pHVar2->has_bits_[0] = pHVar2->has_bits_[0] | 0x100;
      pWVar26->context_pad_ = uVar7;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter det_context_pad for layer type ",0x31);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      bVar11 = false;
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x10) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      pbVar3 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar3 = *pbVar3 | 0x20;
      if (layer_param->window_data_param_ == (WindowDataParameter *)0x0) {
        pWVar26 = (WindowDataParameter *)operator_new(0x58);
        WindowDataParameter::WindowDataParameter(pWVar26);
        layer_param->window_data_param_ = pWVar26;
      }
      pWVar26 = layer_param->window_data_param_;
      psVar9 = (pVVar30->det_crop_mode_).ptr_;
      (pWVar26->_has_bits_).has_bits_[0] = (pWVar26->_has_bits_).has_bits_[0] | 4;
      psVar10 = (pWVar26->crop_mode_).ptr_;
      if (psVar10 == (string *)&WindowDataParameter::_default_crop_mode__abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (&pWVar26->crop_mode_,psVar9);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar10);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter det_crop_mode for layer type ",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      bVar11 = false;
    }
  }
  if (((pVVar30->_has_bits_).has_bits_[0] & 0x80) != 0) {
    iVar28 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar28 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 0x80;
      if (layer_param->hdf5_output_param_ == (HDF5OutputParameter *)0x0) {
        pHVar27 = (HDF5OutputParameter *)operator_new(0x20);
        HDF5OutputParameter::HDF5OutputParameter(pHVar27);
        layer_param->hdf5_output_param_ = pHVar27;
      }
      pHVar27 = pVVar30->hdf5_output_param_;
      if (pHVar27 == (HDF5OutputParameter *)0x0) {
        pHVar27 = (HDF5OutputParameter *)&_HDF5OutputParameter_default_instance_;
      }
      HDF5OutputParameter::CopyFrom(layer_param->hdf5_output_param_,pHVar27);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter hdf5_output_param for layer type ",0x33);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
      bVar11 = false;
    }
  }
  return bVar11;
}

Assistant:

bool UpgradeV0LayerParameter(const V1LayerParameter& v0_layer_connection,
                             V1LayerParameter* layer_param) {
  bool is_fully_compatible = true;
  layer_param->Clear();
  for (int i = 0; i < v0_layer_connection.bottom_size(); ++i) {
    layer_param->add_bottom(v0_layer_connection.bottom(i));
  }
  for (int i = 0; i < v0_layer_connection.top_size(); ++i) {
    layer_param->add_top(v0_layer_connection.top(i));
  }
  if (v0_layer_connection.has_layer()) {
    const V0LayerParameter& v0_layer_param = v0_layer_connection.layer();
    if (v0_layer_param.has_name()) {
      layer_param->set_name(v0_layer_param.name());
    }
    const string& type = v0_layer_param.type();
    if (v0_layer_param.has_type()) {
      layer_param->set_type(UpgradeV0LayerType(type));
    }
    for (int i = 0; i < v0_layer_param.blobs_size(); ++i) {
      layer_param->add_blobs()->CopyFrom(v0_layer_param.blobs(i));
    }
    for (int i = 0; i < v0_layer_param.blobs_lr_size(); ++i) {
      layer_param->add_blobs_lr(v0_layer_param.blobs_lr(i));
    }
    for (int i = 0; i < v0_layer_param.weight_decay_size(); ++i) {
      layer_param->add_weight_decay(v0_layer_param.weight_decay(i));
    }
    if (v0_layer_param.has_num_output()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->set_num_output(
            v0_layer_param.num_output());
      } else if (type == "innerproduct") {
        layer_param->mutable_inner_product_param()->set_num_output(
            v0_layer_param.num_output());
      } else {
        LOG(ERROR) << "Unknown parameter num_output for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_biasterm()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->set_bias_term(
            v0_layer_param.biasterm());
      } else if (type == "innerproduct") {
        layer_param->mutable_inner_product_param()->set_bias_term(
            v0_layer_param.biasterm());
      } else {
        LOG(ERROR) << "Unknown parameter biasterm for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_weight_filler()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->
            mutable_weight_filler()->CopyFrom(v0_layer_param.weight_filler());
      } else if (type == "innerproduct") {
        layer_param->mutable_inner_product_param()->
            mutable_weight_filler()->CopyFrom(v0_layer_param.weight_filler());
      } else {
        LOG(ERROR) << "Unknown parameter weight_filler for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_bias_filler()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->
            mutable_bias_filler()->CopyFrom(v0_layer_param.bias_filler());
      } else if (type == "innerproduct") {
        layer_param->mutable_inner_product_param()->
            mutable_bias_filler()->CopyFrom(v0_layer_param.bias_filler());
      } else {
        LOG(ERROR) << "Unknown parameter bias_filler for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_pad()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->add_pad(v0_layer_param.pad());
      } else if (type == "pool") {
        layer_param->mutable_pooling_param()->set_pad(v0_layer_param.pad());
      } else {
        LOG(ERROR) << "Unknown parameter pad for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_kernelsize()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->add_kernel_size(
            v0_layer_param.kernelsize());
      } else if (type == "pool") {
        layer_param->mutable_pooling_param()->set_kernel_size(
            v0_layer_param.kernelsize());
      } else {
        LOG(ERROR) << "Unknown parameter kernelsize for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_group()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->set_group(
            v0_layer_param.group());
      } else {
        LOG(ERROR) << "Unknown parameter group for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_stride()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->add_stride(
            v0_layer_param.stride());
      } else if (type == "pool") {
        layer_param->mutable_pooling_param()->set_stride(
            v0_layer_param.stride());
      } else {
        LOG(ERROR) << "Unknown parameter stride for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_pool()) {
      if (type == "pool") {
        V0LayerParameter_PoolMethod pool = v0_layer_param.pool();
        switch (pool) {
        case V0LayerParameter_PoolMethod_MAX:
          layer_param->mutable_pooling_param()->set_pool(
              PoolingParameter_PoolMethod_MAX);
          break;
        case V0LayerParameter_PoolMethod_AVE:
          layer_param->mutable_pooling_param()->set_pool(
              PoolingParameter_PoolMethod_AVE);
          break;
        case V0LayerParameter_PoolMethod_STOCHASTIC:
          layer_param->mutable_pooling_param()->set_pool(
              PoolingParameter_PoolMethod_STOCHASTIC);
          break;
        default:
          LOG(ERROR) << "Unknown pool method " << pool;
          is_fully_compatible = false;
        }
      } else {
        LOG(ERROR) << "Unknown parameter pool for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_dropout_ratio()) {
      if (type == "dropout") {
        layer_param->mutable_dropout_param()->set_dropout_ratio(
            v0_layer_param.dropout_ratio());
      } else {
        LOG(ERROR) << "Unknown parameter dropout_ratio for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_local_size()) {
      if (type == "lrn") {
        layer_param->mutable_lrn_param()->set_local_size(
            v0_layer_param.local_size());
      } else {
        LOG(ERROR) << "Unknown parameter local_size for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_alpha()) {
      if (type == "lrn") {
        layer_param->mutable_lrn_param()->set_alpha(v0_layer_param.alpha());
      } else {
        LOG(ERROR) << "Unknown parameter alpha for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_beta()) {
      if (type == "lrn") {
        layer_param->mutable_lrn_param()->set_beta(v0_layer_param.beta());
      } else {
        LOG(ERROR) << "Unknown parameter beta for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_k()) {
      if (type == "lrn") {
        layer_param->mutable_lrn_param()->set_k(v0_layer_param.k());
      } else {
        LOG(ERROR) << "Unknown parameter k for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_source()) {
      if (type == "data") {
        layer_param->mutable_data_param()->set_source(v0_layer_param.source());
      } else if (type == "hdf5_data") {
        layer_param->mutable_hdf5_data_param()->set_source(
            v0_layer_param.source());
      } else if (type == "images") {
        layer_param->mutable_image_data_param()->set_source(
            v0_layer_param.source());
      } else if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_source(
            v0_layer_param.source());
      } else if (type == "infogain_loss") {
        layer_param->mutable_infogain_loss_param()->set_source(
            v0_layer_param.source());
      } else {
        LOG(ERROR) << "Unknown parameter source for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_scale()) {
      layer_param->mutable_transform_param()->
          set_scale(v0_layer_param.scale());
    }
    if (v0_layer_param.has_meanfile()) {
      layer_param->mutable_transform_param()->
          set_mean_file(v0_layer_param.meanfile());
    }
    if (v0_layer_param.has_batchsize()) {
      if (type == "data") {
        layer_param->mutable_data_param()->set_batch_size(
            v0_layer_param.batchsize());
      } else if (type == "hdf5_data") {
        layer_param->mutable_hdf5_data_param()->set_batch_size(
            v0_layer_param.batchsize());
      } else if (type == "images") {
        layer_param->mutable_image_data_param()->set_batch_size(
            v0_layer_param.batchsize());
      } else if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_batch_size(
            v0_layer_param.batchsize());
      } else {
        LOG(ERROR) << "Unknown parameter batchsize for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_cropsize()) {
      layer_param->mutable_transform_param()->
          set_crop_size(v0_layer_param.cropsize());
    }
    if (v0_layer_param.has_mirror()) {
      layer_param->mutable_transform_param()->
          set_mirror(v0_layer_param.mirror());
    }
    if (v0_layer_param.has_rand_skip()) {
      if (type == "data") {
        layer_param->mutable_data_param()->set_rand_skip(
            v0_layer_param.rand_skip());
      } else if (type == "images") {
        layer_param->mutable_image_data_param()->set_rand_skip(
            v0_layer_param.rand_skip());
      } else {
        LOG(ERROR) << "Unknown parameter rand_skip for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_shuffle_images()) {
      if (type == "images") {
        layer_param->mutable_image_data_param()->set_shuffle(
            v0_layer_param.shuffle_images());
      } else {
        LOG(ERROR) << "Unknown parameter shuffle for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_new_height()) {
      if (type == "images") {
        layer_param->mutable_image_data_param()->set_new_height(
            v0_layer_param.new_height());
      } else {
        LOG(ERROR) << "Unknown parameter new_height for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_new_width()) {
      if (type == "images") {
        layer_param->mutable_image_data_param()->set_new_width(
            v0_layer_param.new_width());
      } else {
        LOG(ERROR) << "Unknown parameter new_width for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_concat_dim()) {
      if (type == "concat") {
        layer_param->mutable_concat_param()->set_concat_dim(
            v0_layer_param.concat_dim());
      } else {
        LOG(ERROR) << "Unknown parameter concat_dim for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_fg_threshold()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_fg_threshold(
            v0_layer_param.det_fg_threshold());
      } else {
        LOG(ERROR) << "Unknown parameter det_fg_threshold for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_bg_threshold()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_bg_threshold(
            v0_layer_param.det_bg_threshold());
      } else {
        LOG(ERROR) << "Unknown parameter det_bg_threshold for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_fg_fraction()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_fg_fraction(
            v0_layer_param.det_fg_fraction());
      } else {
        LOG(ERROR) << "Unknown parameter det_fg_fraction for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_context_pad()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_context_pad(
            v0_layer_param.det_context_pad());
      } else {
        LOG(ERROR) << "Unknown parameter det_context_pad for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_crop_mode()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_crop_mode(
            v0_layer_param.det_crop_mode());
      } else {
        LOG(ERROR) << "Unknown parameter det_crop_mode for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_hdf5_output_param()) {
      if (type == "hdf5_output") {
        layer_param->mutable_hdf5_output_param()->CopyFrom(
            v0_layer_param.hdf5_output_param());
      } else {
        LOG(ERROR) << "Unknown parameter hdf5_output_param for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
  }
  return is_fully_compatible;
}